

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device6.c
# Opt level: O0

void device6(void *arg)

{
  int sock;
  int sock_00;
  int iVar1;
  bool bVar2;
  int dev3;
  int dev2;
  int rc;
  void *arg_local;
  
  sock = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/device6.c"
                          ,0x3f,2,99);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/device6.c"
                    ,0x40,sock,socket_address_i);
  sock_00 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/device6.c"
                             ,0x41,2,0x62);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/device6.c"
                 ,0x42,sock_00,socket_address_j);
  iVar1 = nn_device(sock,sock_00);
  bVar2 = false;
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    bVar2 = iVar1 == 9;
  }
  if (!bVar2) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == EBADF",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/device6.c",
            0x46);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/device6.c"
                  ,0x49,sock);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/device6.c"
                  ,0x4a,sock_00);
  return;
}

Assistant:

void device6 (NN_UNUSED void *arg)
{
    int rc;
    int dev2;
    int dev3;

    dev2 = test_socket (AF_SP_RAW, NN_RESPONDENT);
    test_connect (dev2, socket_address_i);
    dev3 = test_socket (AF_SP_RAW, NN_SURVEYOR);
    test_bind (dev3, socket_address_j);

    /*  Run the device. */
    rc = nn_device (dev2, dev3);
    nn_assert (rc < 0 && nn_errno () == EBADF);

    /*  Clean up. */
    test_close (dev2);
    test_close (dev3);
}